

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

Node * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseToNode(TaggerImpl *this,char *str,size_t len)

{
  int iVar1;
  Lattice *pLVar2;
  undefined4 extraout_var;
  
  pLVar2 = mutable_lattice(this);
  (*pLVar2->_vptr_Lattice[10])(pLVar2,str,len);
  initRequestType(this);
  iVar1 = (**(this->super_Tagger)._vptr_Tagger)(this,pLVar2);
  if ((char)iVar1 != '\0') {
    iVar1 = (*pLVar2->_vptr_Lattice[2])();
    return (Node *)CONCAT44(extraout_var,iVar1);
  }
  (*pLVar2->_vptr_Lattice[0x24])(pLVar2);
  std::__cxx11::string::assign((char *)&this->what_);
  return (Node *)0x0;
}

Assistant:

const Node *TaggerImpl::parseToNode(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }
  return lattice->bos_node();
}